

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpege_base.c
# Opt level: O2

MPP_RET hal_jpege_vepu_init_rc(HalJpegeRc *hal_rc)

{
  MPP_RET MVar1;
  RK_U8 *pRVar2;
  
  hal_rc->qtable_c = (RK_U8 *)0x0;
  *(undefined8 *)&hal_rc->last_quality = 0;
  *(undefined8 *)hal_rc = 0;
  hal_rc->qtable_y = (RK_U8 *)0x0;
  pRVar2 = (RK_U8 *)mpp_osal_malloc("hal_jpege_vepu_init_rc",0x40);
  hal_rc->qtable_y = pRVar2;
  pRVar2 = (RK_U8 *)mpp_osal_malloc("hal_jpege_vepu_init_rc",0x40);
  hal_rc->qtable_c = pRVar2;
  MVar1 = MPP_OK;
  if (pRVar2 == (RK_U8 *)0x0 || hal_rc->qtable_y == (RK_U8 *)0x0) {
    _mpp_log_l(2,"hal_jpege_base","qtable is null, malloc err\n","hal_jpege_vepu_init_rc");
    MVar1 = MPP_ERR_MALLOC;
  }
  return MVar1;
}

Assistant:

MPP_RET hal_jpege_vepu_init_rc(HalJpegeRc *hal_rc)
{
    memset(hal_rc, 0, sizeof(HalJpegeRc));
    hal_rc->qtable_y = mpp_malloc(RK_U8, QUANTIZE_TABLE_SIZE);
    hal_rc->qtable_c = mpp_malloc(RK_U8, QUANTIZE_TABLE_SIZE);

    if (NULL == hal_rc->qtable_y || NULL == hal_rc->qtable_c) {
        mpp_err_f("qtable is null, malloc err\n");
        return MPP_ERR_MALLOC;
    }

    return MPP_OK;
}